

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O3

FT_Error FT_Outline_EmboldenXY(FT_Outline *outline,FT_Pos xstrength,FT_Pos ystrength)

{
  FT_Vector *pFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FT_UInt32 FVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  FT_Error FVar13;
  long lVar14;
  FT_Long FVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  FT_Long a_;
  int iVar19;
  FT_Vector local_c8;
  long local_b8;
  ulong local_b0;
  FT_Orientation local_a4;
  ulong local_a0;
  ulong local_98;
  long local_90;
  long local_88;
  long local_80;
  ulong local_78;
  short *local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  if (outline == (FT_Outline *)0x0) {
    FVar13 = 0x14;
  }
  else {
    FVar13 = 0;
    if (2 < xstrength + 1U || 2 < ystrength + 1U) {
      local_a4 = FT_Outline_Get_Orientation(outline);
      if (local_a4 == FT_ORIENTATION_NONE) {
        FVar13 = 6;
        if (outline->n_contours == 0) {
          FVar13 = 0;
        }
      }
      else {
        local_68 = (long)outline->n_contours;
        FVar13 = 0;
        if (0 < local_68) {
          local_98 = xstrength / 2;
          local_a0 = ystrength / 2;
          pFVar1 = outline->points;
          local_70 = outline->contours;
          local_50 = (long)(int)local_98;
          local_58 = (long)(int)local_a0;
          local_60 = 0;
          iVar12 = 0;
          do {
            iVar11 = (int)local_70[local_60];
            if (iVar12 != iVar11 && iVar11 != -1) {
              iVar18 = -1;
              local_78 = 0;
              local_80 = 0;
              local_88 = 0;
              uVar8 = 0;
              lVar9 = 0;
              lVar7 = 0;
              iVar19 = iVar11;
              iVar3 = iVar12;
              do {
                if (iVar3 == iVar18) {
                  local_c8.x = local_80;
                  local_c8.y = local_88;
                  uVar6 = local_78;
LAB_00216c17:
                  lVar10 = local_c8.x;
                  lVar16 = local_c8.y;
                  iVar4 = iVar3;
                  if (uVar8 != 0) {
                    if (iVar18 < 0) {
                      iVar18 = iVar19;
                      local_88 = lVar7;
                      local_80 = lVar9;
                      local_78 = uVar8;
                    }
                    local_b8 = (long)(int)lVar9;
                    lVar10 = (int)local_c8.x * local_b8;
                    lVar14 = (long)(int)local_c8.y * (long)(int)lVar7;
                    lVar10 = (long)(int)((ulong)(lVar14 + 0x8000 + (lVar14 >> 0x3f)) >> 0x10) +
                             (long)(int)((ulong)(lVar10 + 0x8000 + (lVar10 >> 0x3f)) >> 0x10);
                    local_38 = local_c8.x;
                    local_b0 = uVar6;
                    if (lVar10 < -0xefff) {
                      lVar9 = 0;
                      FVar15 = 0;
                    }
                    else {
                      local_40 = lVar10 + 0x10000;
                      local_90 = local_c8.y;
                      a_ = lVar9 + local_c8.x;
                      FVar15 = -(lVar7 + local_c8.y);
                      lVar9 = (long)(int)local_c8.x * (long)(int)lVar7;
                      local_b8 = (int)local_c8.y * local_b8;
                      lVar9 = (long)(int)((ulong)(lVar9 + 0x8000 + (lVar9 >> 0x3f)) >> 0x10) -
                              (long)(int)((ulong)(local_b8 + 0x8000 + (local_b8 >> 0x3f)) >> 0x10);
                      local_48 = -lVar9;
                      if (local_a4 != FT_ORIENTATION_FILL_RIGHT) {
                        local_48 = lVar9;
                        FVar15 = lVar7 + local_c8.y;
                        a_ = -a_;
                      }
                      if ((long)uVar6 <= (long)uVar8) {
                        uVar8 = uVar6;
                      }
                      iVar17 = (int)local_48;
                      lVar7 = iVar17 * local_50;
                      lVar9 = (long)(int)local_40 * (long)(int)uVar8;
                      local_b8 = (long)(int)((ulong)(lVar9 + 0x8000 + (lVar9 >> 0x3f)) >> 0x10);
                      lVar9 = local_40;
                      uVar6 = local_98;
                      if (local_b8 < (int)((ulong)(lVar7 + 0x8000 + (lVar7 >> 0x3f)) >> 0x10)) {
                        lVar9 = local_48;
                        uVar6 = uVar8;
                      }
                      FVar15 = FT_MulDiv(FVar15,uVar6,lVar9);
                      lVar7 = iVar17 * local_58;
                      lVar9 = local_40;
                      uVar6 = local_a0;
                      if (local_b8 < (int)((ulong)((lVar7 >> 0x3f) + lVar7 + 0x8000) >> 0x10)) {
                        lVar9 = local_48;
                        uVar6 = uVar8;
                      }
                      lVar9 = FT_MulDiv(a_,uVar6,lVar9);
                      lVar16 = local_90;
                    }
                    uVar6 = local_b0;
                    lVar10 = local_38;
                    if (iVar19 != iVar3) {
                      do {
                        pFVar1[iVar19].x = pFVar1[iVar19].x + FVar15 + local_98;
                        pFVar1[iVar19].y = pFVar1[iVar19].y + lVar9 + local_a0;
                        bVar2 = iVar11 <= iVar19;
                        iVar19 = iVar19 + 1;
                        if (bVar2) {
                          iVar19 = iVar12;
                        }
                      } while (iVar19 != iVar3);
                    }
                  }
                }
                else {
                  local_c8.x = pFVar1[iVar3].x - pFVar1[iVar19].x;
                  local_c8.y = pFVar1[iVar3].y - pFVar1[iVar19].y;
                  FVar5 = FT_Vector_NormLen(&local_c8);
                  uVar6 = uVar8;
                  lVar10 = lVar9;
                  lVar16 = lVar7;
                  iVar4 = iVar19;
                  if (FVar5 != 0) {
                    uVar6 = (ulong)FVar5;
                    goto LAB_00216c17;
                  }
                }
                iVar19 = iVar4;
                bVar2 = iVar11 <= iVar3;
                iVar3 = iVar3 + 1;
                if (bVar2) {
                  iVar3 = iVar12;
                }
              } while ((iVar3 != iVar19) &&
                      (uVar8 = uVar6, lVar9 = lVar10, lVar7 = lVar16, iVar19 != iVar18));
            }
            iVar12 = iVar11 + 1;
            local_60 = local_60 + 1;
          } while (local_60 != local_68);
          FVar13 = 0;
        }
      }
    }
  }
  return FVar13;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_EmboldenXY( FT_Outline*  outline,
                         FT_Pos       xstrength,
                         FT_Pos       ystrength )
  {
    FT_Vector*      points;
    FT_Int          c, first, last;
    FT_Orientation  orientation;


    if ( !outline )
      return FT_THROW( Invalid_Outline );

    xstrength /= 2;
    ystrength /= 2;
    if ( xstrength == 0 && ystrength == 0 )
      return FT_Err_Ok;

    orientation = FT_Outline_Get_Orientation( outline );
    if ( orientation == FT_ORIENTATION_NONE )
    {
      if ( outline->n_contours )
        return FT_THROW( Invalid_Argument );
      else
        return FT_Err_Ok;
    }

    points = outline->points;

    first = 0;
    for ( c = 0; c < outline->n_contours; c++ )
    {
      FT_Vector  in, out, anchor, shift;
      FT_Fixed   l_in, l_out, l_anchor = 0, l, q, d;
      FT_Int     i, j, k;


      l_in = 0;
      last = outline->contours[c];

      /* pacify compiler */
      in.x = in.y = anchor.x = anchor.y = 0;

      /* Counter j cycles though the points; counter i advances only  */
      /* when points are moved; anchor k marks the first moved point. */
      for ( i = last, j = first, k = -1;
            j != i && i != k;
            j = j < last ? j + 1 : first )
      {
        if ( j != k )
        {
          out.x = points[j].x - points[i].x;
          out.y = points[j].y - points[i].y;
          l_out = (FT_Fixed)FT_Vector_NormLen( &out );

          if ( l_out == 0 )
            continue;
        }
        else
        {
          out   = anchor;
          l_out = l_anchor;
        }

        if ( l_in != 0 )
        {
          if ( k < 0 )
          {
            k        = i;
            anchor   = in;
            l_anchor = l_in;
          }

          d = FT_MulFix( in.x, out.x ) + FT_MulFix( in.y, out.y );

          /* shift only if turn is less than ~160 degrees */
          if ( d > -0xF000L )
          {
            d = d + 0x10000L;

            /* shift components along lateral bisector in proper orientation */
            shift.x = in.y + out.y;
            shift.y = in.x + out.x;

            if ( orientation == FT_ORIENTATION_TRUETYPE )
              shift.x = -shift.x;
            else
              shift.y = -shift.y;

            /* restrict shift magnitude to better handle collapsing segments */
            q = FT_MulFix( out.x, in.y ) - FT_MulFix( out.y, in.x );
            if ( orientation == FT_ORIENTATION_TRUETYPE )
              q = -q;

            l = FT_MIN( l_in, l_out );

            /* non-strict inequalities avoid divide-by-zero when q == l == 0 */
            if ( FT_MulFix( xstrength, q ) <= FT_MulFix( l, d ) )
              shift.x = FT_MulDiv( shift.x, xstrength, d );
            else
              shift.x = FT_MulDiv( shift.x, l, q );


            if ( FT_MulFix( ystrength, q ) <= FT_MulFix( l, d ) )
              shift.y = FT_MulDiv( shift.y, ystrength, d );
            else
              shift.y = FT_MulDiv( shift.y, l, q );
          }
          else
            shift.x = shift.y = 0;

          for ( ;
                i != j;
                i = i < last ? i + 1 : first )
          {
            points[i].x += xstrength + shift.x;
            points[i].y += ystrength + shift.y;
          }
        }
        else
          i = j;

        in   = out;
        l_in = l_out;
      }

      first = last + 1;
    }

    return FT_Err_Ok;
  }